

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filesystem-disk-unix.c++
# Opt level: O0

ssize_t __thiscall
kj::anon_unknown_9::DiskHandle::read(DiskHandle *this,int __fd,void *__buf,size_t __nbytes)

{
  char *start;
  int osErrorNumber;
  size_t sVar1;
  void *pvVar2;
  ArrayPtr<unsigned_char> AVar3;
  DiskHandle *local_88;
  uchar *local_80;
  Fault local_68;
  Fault f;
  SyscallResult local_3c;
  undefined1 auStack_38 [4];
  SyscallResult _kjSyscallResult;
  ssize_t n;
  size_t total;
  uint64_t offset_local;
  DiskHandle *this_local;
  ArrayPtr<unsigned_char> buffer_local;
  
  n = 0;
  this_local = (DiskHandle *)__buf;
  buffer_local.ptr = (uchar *)__nbytes;
  while( true ) {
    sVar1 = ArrayPtr<unsigned_char>::size((ArrayPtr<unsigned_char> *)&this_local);
    if (sVar1 == 0) {
      return n;
    }
    f.exception = (Exception *)auStack_38;
    local_3c = kj::_::Debug::
               syscall<kj::(anonymous_namespace)::DiskHandle::read(unsigned_long,kj::ArrayPtr<unsigned_char>)const::_lambda()_1_>
                         ((anon_class_32_4_f289ffb2 *)&f,false);
    pvVar2 = kj::_::Debug::SyscallResult::operator_cast_to_void_(&local_3c);
    start = _auStack_38;
    if (pvVar2 == (void *)0x0) break;
    if (_auStack_38 == (char *)0x0) {
      return n;
    }
    n = (ssize_t)(_auStack_38 + n);
    sVar1 = ArrayPtr<unsigned_char>::size((ArrayPtr<unsigned_char> *)&this_local);
    AVar3 = ArrayPtr<unsigned_char>::slice
                      ((ArrayPtr<unsigned_char> *)&this_local,(size_t)start,sVar1);
    local_88 = (DiskHandle *)AVar3.ptr;
    this_local = local_88;
    local_80 = (uchar *)AVar3.size_;
    buffer_local.ptr = local_80;
  }
  osErrorNumber = kj::_::Debug::SyscallResult::getErrorNumber(&local_3c);
  kj::_::Debug::Fault::Fault
            (&local_68,
             "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/filesystem-disk-unix.c++"
             ,0x15f,osErrorNumber,"n = pread(fd, buffer.begin(), buffer.size(), offset)","");
  kj::_::Debug::Fault::fatal(&local_68);
}

Assistant:

size_t read(uint64_t offset, ArrayPtr<byte> buffer) const {
    // pread() probably never returns short reads unless it hits EOF. Unfortunately, though, per
    // spec we are not allowed to assume this.

    size_t total = 0;
    while (buffer.size() > 0) {
      ssize_t n;
      KJ_SYSCALL(n = pread(fd, buffer.begin(), buffer.size(), offset));
      if (n == 0) break;
      total += n;
      offset += n;
      buffer = buffer.slice(n, buffer.size());
    }
    return total;
  }